

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O0

void __thiscall amrex::StateData::setTimeLevel(StateData *this,Real time,Real dt_old,Real dt_new)

{
  TimeCenter TVar1;
  long in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  
  TVar1 = StateDescriptor::timeType(*(StateDescriptor **)(in_RDI + 8));
  if (TVar1 == Point) {
    *(double *)(in_RDI + 0xb0) = in_XMM0_Qa;
    *(double *)(in_RDI + 0xa8) = in_XMM0_Qa;
    *(double *)(in_RDI + 0xc0) = in_XMM0_Qa - in_XMM1_Qa;
    *(double *)(in_RDI + 0xb8) = in_XMM0_Qa - in_XMM1_Qa;
  }
  else {
    *(double *)(in_RDI + 0xa8) = in_XMM0_Qa;
    *(double *)(in_RDI + 0xb0) = in_XMM0_Qa + in_XMM2_Qa;
    *(double *)(in_RDI + 0xb8) = in_XMM0_Qa - in_XMM1_Qa;
    *(double *)(in_RDI + 0xc0) = in_XMM0_Qa;
  }
  return;
}

Assistant:

void
StateData::setTimeLevel (Real time,
                         Real dt_old,
                         Real dt_new)
{
    if (desc->timeType() == StateDescriptor::Point)
    {
        new_time.start = new_time.stop = time;
        old_time.start = old_time.stop = time - dt_old;
    }
    else
    {
        new_time.start = time;
        new_time.stop  = time+dt_new;
        old_time.start = time-dt_old;
        old_time.stop  = time;
    }
}